

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O0

size_t FSE_buildDTable(FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  uint *in_RDI;
  U32 nextState;
  BYTE symbol;
  U32 u;
  int i;
  U32 position;
  U32 s_1;
  U32 step;
  U32 tableMask;
  U32 s;
  S16 largeLimit;
  FSE_DTableHeader DTableH;
  U32 highThreshold;
  U32 tableSize;
  U32 maxSV1;
  U16 symbolNext [256];
  FSE_decode_t *tableDecode;
  void *tdPtr;
  uint local_268;
  int local_264;
  uint local_260;
  uint local_25c;
  uint local_250;
  undefined4 local_248;
  uint local_244;
  ushort auStack_238 [260];
  uint *local_30;
  uint *local_28;
  uint local_20;
  long local_18;
  uint *local_10;
  size_t local_8;
  
  local_28 = in_RDI + 1;
  local_30 = in_RDI + 1;
  uVar4 = 1 << ((byte)in_ECX & 0x1f);
  local_244 = uVar4 - 1;
  if (in_EDX < 0x100) {
    if (in_ECX < 0xd) {
      local_248 = CONCAT22(1,(short)in_ECX);
      local_20 = in_ECX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      for (local_250 = 0; local_250 < in_EDX + 1; local_250 = local_250 + 1) {
        if (*(short *)(local_18 + (ulong)local_250 * 2) == -1) {
          *(char *)((long)local_30 + (ulong)local_244 * 4 + 2) = (char)local_250;
          auStack_238[local_250] = 1;
          local_244 = local_244 - 1;
        }
        else {
          if ((short)(1 << ((byte)in_ECX - 1 & 0x1f)) <= *(short *)(local_18 + (ulong)local_250 * 2)
             ) {
            local_248 = local_248 & 0xffff;
          }
          auStack_238[local_250] = *(ushort *)(local_18 + (ulong)local_250 * 2);
        }
      }
      *local_10 = local_248;
      local_260 = 0;
      for (local_25c = 0; local_25c < in_EDX + 1; local_25c = local_25c + 1) {
        for (local_264 = 0; local_264 < *(short *)(local_18 + (ulong)local_25c * 2);
            local_264 = local_264 + 1) {
          *(char *)((long)local_30 + (ulong)local_260 * 4 + 2) = (char)local_25c;
          do {
            local_260 = local_260 + (uVar4 >> 1) + (uVar4 >> 3) + 3 & uVar4 - 1;
          } while (local_244 < local_260);
        }
      }
      if (local_260 == 0) {
        for (local_268 = 0; local_268 < uVar4; local_268 = local_268 + 1) {
          bVar1 = *(byte *)((long)local_30 + (ulong)local_268 * 4 + 2);
          uVar2 = auStack_238[bVar1];
          auStack_238[bVar1] = uVar2 + 1;
          uVar3 = local_20;
          uVar5 = BIT_highbit32((uint)uVar2);
          *(char *)((long)local_30 + (ulong)local_268 * 4 + 3) = (char)uVar3 - (char)uVar5;
          *(ushort *)(local_30 + local_268) =
               (uVar2 << (*(byte *)((long)local_30 + (ulong)local_268 * 4 + 3) & 0x1f)) -
               (short)uVar4;
        }
        local_8 = 0;
      }
      else {
        local_8 = 0xffffffffffffffff;
      }
    }
    else {
      local_8 = 0xffffffffffffffd4;
    }
  }
  else {
    local_8 = 0xffffffffffffffd2;
  }
  return local_8;
}

Assistant:

size_t FSE_buildDTable(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16 symbolNext[FSE_MAX_SYMBOL_VALUE+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}